

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashing.h
# Opt level: O0

void llvm::hashing::detail::hash_state::mix_32_bytes(char *s,uint64_t *a,uint64_t *b)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t d;
  uint64_t c;
  uint64_t *b_local;
  uint64_t *a_local;
  char *s_local;
  
  uVar1 = fetch64(s);
  *a = uVar1 + *a;
  uVar2 = fetch64(s + 0x18);
  uVar1 = rotate(*b + *a + uVar2,0x15);
  *b = uVar1;
  uVar1 = *a;
  uVar3 = fetch64(s + 8);
  uVar4 = fetch64(s + 0x10);
  *a = uVar3 + uVar4 + *a;
  uVar3 = rotate(*a,0x2c);
  *b = uVar3 + uVar1 + *b;
  *a = uVar2 + *a;
  return;
}

Assistant:

static void mix_32_bytes(const char *s, uint64_t &a, uint64_t &b) {
    a += fetch64(s);
    uint64_t c = fetch64(s + 24);
    b = rotate(b + a + c, 21);
    uint64_t d = a;
    a += fetch64(s + 8) + fetch64(s + 16);
    b += rotate(a, 44) + d;
    a += c;
  }